

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hit_list.hpp
# Opt level: O3

bool __thiscall
hit_list<double>::is_hit
          (hit_list<double> *this,ray<double> *r,double *t_min,double *t_max,hit_rec<double> *rec)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  int iVar4;
  shared_ptr<hit<double>_> *obj;
  pointer psVar5;
  double best_guess;
  hit_rec<double> temp;
  double local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  double local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 uStack_48;
  undefined8 uStack_47;
  
  local_68 = (element_type *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0.0;
  dStack_90 = 0.0;
  local_a8 = *t_max;
  psVar5 = (this->obj_list).
           super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->obj_list).
           super__Vector_base<std::shared_ptr<hit<double>_>,_std::allocator<std::shared_ptr<hit<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar1) {
    bVar3 = false;
  }
  else {
    local_a0 = &(rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
    bVar3 = false;
    do {
      peVar2 = (psVar5->super___shared_ptr<hit<double>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar4 = (**peVar2->_vptr_hit)(peVar2,r,t_min,&local_a8,&local_98);
      if ((char)iVar4 != '\0') {
        local_a8 = local_58;
        (rec->n).e[1] = local_78;
        (rec->n).e[2] = dStack_70;
        (rec->p).e[2] = local_88;
        (rec->n).e[0] = dStack_80;
        (rec->p).e[0] = local_98;
        (rec->p).e[1] = dStack_90;
        (rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_68;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(local_a0,&_Stack_60);
        rec->t = local_58;
        rec->u = (double)CONCAT71(uStack_4f,uStack_50);
        *(ulong *)((long)&rec->u + 1) = CONCAT17(uStack_48,uStack_4f);
        *(undefined8 *)((long)&rec->v + 1) = uStack_47;
        bVar3 = true;
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
    if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
    }
  }
  return bVar3;
}

Assistant:

hit_list() {}